

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::GetUtf8CharByIndex
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *source,int64_t index)

{
  char *utf8Str;
  size_t sVar1;
  size_t i;
  size_t sVar2;
  String out;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_48;
  
  utf8Str = GetUtf8CstrByIndex(source,index);
  if (utf8Str == (char *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    sVar1 = GetUtf8CharSize(utf8Str);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                (&local_48,utf8Str[sVar2]);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
              (__return_storage_ptr__,&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> GetUtf8CharByIndex(const String & source, int64_t index)
	{
		const char * srcCurr = GetUtf8CstrByIndex(source, index);
		if (srcCurr == nullptr)
			return std::optional<String>();
		size_t charCount = GetUtf8CharSize(srcCurr);
		String out;
		for (size_t i = 0; i < charCount; ++i)
			out += srcCurr[i];
		return out;
	}